

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

extent_t * extent_heap_first(extent_heap_t *ph)

{
  extent_t *peVar1;
  int iVar2;
  extent_t *peVar3;
  extent_t *a;
  extent_t *peVar4;
  extent_t *peVar5;
  extent_t *peVar6;
  extent_t *peVar7;
  
  a = ph->ph_root;
  if (a == (extent_t *)0x0) {
    a = (extent_t *)0x0;
  }
  else {
    peVar4 = (a->ph_link).phn_next;
    if (peVar4 != (extent_t *)0x0) {
      (a->ph_link).phn_prev = (extent_t *)0x0;
      (a->ph_link).phn_next = (extent_t *)0x0;
      (peVar4->ph_link).phn_prev = (extent_t *)0x0;
      peVar6 = (peVar4->ph_link).phn_next;
      peVar3 = peVar4;
      if (peVar6 != (extent_t *)0x0) {
        peVar5 = (peVar6->ph_link).phn_next;
        if (peVar5 != (extent_t *)0x0) {
          (peVar5->ph_link).phn_prev = (extent_t *)0x0;
        }
        (peVar4->ph_link).phn_prev = (extent_t *)0x0;
        (peVar4->ph_link).phn_next = (extent_t *)0x0;
        (peVar6->ph_link).phn_prev = (extent_t *)0x0;
        (peVar6->ph_link).phn_next = (extent_t *)0x0;
        iVar2 = extent_snad_comp(peVar4,peVar6);
        if (iVar2 < 0) {
          (peVar6->ph_link).phn_prev = peVar4;
          peVar7 = (peVar4->ph_link).phn_lchild;
          (peVar6->ph_link).phn_next = peVar7;
          if (peVar7 != (extent_t *)0x0) {
            (peVar7->ph_link).phn_prev = peVar6;
          }
          (peVar4->ph_link).phn_lchild = peVar6;
        }
        else {
          (peVar4->ph_link).phn_prev = peVar6;
          peVar3 = (peVar6->ph_link).phn_lchild;
          (peVar4->ph_link).phn_next = peVar3;
          if (peVar3 != (extent_t *)0x0) {
            (peVar3->ph_link).phn_prev = peVar4;
          }
          (peVar6->ph_link).phn_lchild = peVar4;
          peVar4 = peVar6;
          peVar3 = peVar6;
        }
        while (peVar5 != (extent_t *)0x0) {
          peVar6 = (peVar5->ph_link).phn_next;
          if (peVar6 == (extent_t *)0x0) {
            peVar7 = (extent_t *)0x0;
          }
          else {
            peVar7 = (peVar6->ph_link).phn_next;
            if (peVar7 != (extent_t *)0x0) {
              (peVar7->ph_link).phn_prev = (extent_t *)0x0;
            }
            (peVar5->ph_link).phn_prev = (extent_t *)0x0;
            (peVar5->ph_link).phn_next = (extent_t *)0x0;
            (peVar6->ph_link).phn_prev = (extent_t *)0x0;
            (peVar6->ph_link).phn_next = (extent_t *)0x0;
            iVar2 = extent_snad_comp(peVar5,peVar6);
            if (iVar2 < 0) {
              (peVar6->ph_link).phn_prev = peVar5;
              peVar1 = (peVar5->ph_link).phn_lchild;
              (peVar6->ph_link).phn_next = peVar1;
              if (peVar1 != (extent_t *)0x0) {
                (peVar1->ph_link).phn_prev = peVar6;
              }
              (peVar5->ph_link).phn_lchild = peVar6;
            }
            else {
              (peVar5->ph_link).phn_prev = peVar6;
              peVar1 = (peVar6->ph_link).phn_lchild;
              (peVar5->ph_link).phn_next = peVar1;
              if (peVar1 != (extent_t *)0x0) {
                (peVar1->ph_link).phn_prev = peVar5;
              }
              (peVar6->ph_link).phn_lchild = peVar5;
              peVar5 = peVar6;
            }
          }
          (peVar4->ph_link).phn_next = peVar5;
          peVar4 = peVar5;
          peVar5 = peVar7;
        }
        peVar6 = (peVar3->ph_link).phn_next;
        if (peVar6 != (extent_t *)0x0) {
          while( true ) {
            peVar5 = (peVar6->ph_link).phn_next;
            (peVar3->ph_link).phn_next = (extent_t *)0x0;
            (peVar6->ph_link).phn_next = (extent_t *)0x0;
            iVar2 = extent_snad_comp(peVar3,peVar6);
            if (iVar2 < 0) {
              (peVar6->ph_link).phn_prev = peVar3;
              peVar7 = (peVar3->ph_link).phn_lchild;
              (peVar6->ph_link).phn_next = peVar7;
              if (peVar7 != (extent_t *)0x0) {
                (peVar7->ph_link).phn_prev = peVar6;
              }
              (peVar3->ph_link).phn_lchild = peVar6;
            }
            else {
              (peVar3->ph_link).phn_prev = peVar6;
              peVar7 = (peVar6->ph_link).phn_lchild;
              (peVar3->ph_link).phn_next = peVar7;
              if (peVar7 != (extent_t *)0x0) {
                (peVar7->ph_link).phn_prev = peVar3;
              }
              (peVar6->ph_link).phn_lchild = peVar3;
              peVar3 = peVar6;
            }
            if (peVar5 == (extent_t *)0x0) break;
            (peVar4->ph_link).phn_next = peVar3;
            peVar6 = (peVar5->ph_link).phn_next;
            peVar4 = peVar3;
            peVar3 = peVar5;
          }
        }
      }
      iVar2 = extent_snad_comp(a,peVar3);
      if (iVar2 < 0) {
        (peVar3->ph_link).phn_prev = a;
        ph = (extent_heap_t *)&(a->ph_link).phn_lchild;
        peVar4 = (a->ph_link).phn_lchild;
        (peVar3->ph_link).phn_next = peVar4;
        if (peVar4 != (extent_t *)0x0) {
          (peVar4->ph_link).phn_prev = peVar3;
        }
      }
      else {
        (a->ph_link).phn_prev = peVar3;
        peVar4 = (peVar3->ph_link).phn_lchild;
        (a->ph_link).phn_next = peVar4;
        if (peVar4 != (extent_t *)0x0) {
          (peVar4->ph_link).phn_prev = a;
        }
        (peVar3->ph_link).phn_lchild = a;
        a = peVar3;
      }
      *ph = (extent_heap_t)peVar3;
    }
  }
  return a;
}

Assistant:

bool
extents_init(tsdn_t *tsdn, extents_t *extents, extent_state_t state,
    bool delay_coalesce) {
	if (malloc_mutex_init(&extents->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	for (unsigned i = 0; i < SC_NPSIZES + 1; i++) {
		extent_heap_new(&extents->heaps[i]);
	}
	bitmap_init(extents->bitmap, &extents_bitmap_info, true);
	extent_list_init(&extents->lru);
	atomic_store_zu(&extents->npages, 0, ATOMIC_RELAXED);
	extents->state = state;
	extents->delay_coalesce = delay_coalesce;
	return false;
}